

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageFieldGenerator::GenerateParsingCode
          (MessageFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  Printer *printer_local;
  MessageFieldGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                     "if ($has_not_property_check$) {\n  $property_name$ = new $type_name$();\n}\n")
  ;
  TVar1 = FieldDescriptor::type((this->super_FieldGeneratorBase).descriptor_);
  if (TVar1 == TYPE_MESSAGE) {
    io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                       "input.ReadMessage($property_name$);\n");
  }
  else {
    io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                       "input.ReadGroup($property_name$);\n");
  }
  return;
}

Assistant:

void MessageFieldGenerator::GenerateParsingCode(io::Printer* printer) {
  printer->Print(
    variables_,
    "if ($has_not_property_check$) {\n"
    "  $property_name$ = new $type_name$();\n"
    "}\n");
  if (descriptor_->type() == FieldDescriptor::Type::TYPE_MESSAGE) {
    printer->Print(variables_, "input.ReadMessage($property_name$);\n");
  } else {
    printer->Print(variables_, "input.ReadGroup($property_name$);\n");
  }
}